

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O2

err_t btokSMCmdWrap(octet *apdu,size_t *count,apdu_cmd_t *cmd,void *state)

{
  void *state_00;
  ulong count_00;
  octet oVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  octet *der;
  long lVar6;
  ulong uVar7;
  long lStack_60;
  long local_58;
  
  bVar2 = apduCmdIsValid(cmd);
  if (bVar2 == 0) {
    return 0x138;
  }
  if ((state != (void *)0x0) && ((cmd->cla & 4) != 0)) {
    return 0x138;
  }
  sVar3 = apduCmdEnc(apdu,cmd);
  if (sVar3 == 0xffffffffffffffff) {
    return 0x138;
  }
  if (state == (void *)0x0) {
    if (count == (size_t *)0x0) {
      return 0;
    }
  }
  else {
    sVar3 = cmd->cdf_len;
    if (sVar3 == 0) {
      lVar6 = 0;
    }
    else {
      sVar4 = derTLEnc((octet *)0x0,0x87,sVar3 + 1);
      lVar6 = sVar3 + sVar4 + 1;
    }
    if (cmd->rdf_len != 0) {
      sVar3 = apduCmdRDFLenLen(cmd);
      sVar3 = derEnc((octet *)0x0,0x97,(void *)0x0,sVar3);
      lVar6 = lVar6 + sVar3;
    }
    sVar3 = derEnc((octet *)0x0,0x8e,(void *)0x0,8);
    uVar5 = sVar3 + lVar6;
    uVar7 = (ulong)((uint)(0xff < uVar5) * 2);
    if (apdu == (octet *)0x0) {
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar3 = uVar7 + 6 + uVar5;
    }
    else {
      if ((*(byte *)((long)state + 0x40) & 1) == 0) {
        return 0x205;
      }
      *apdu = *apdu | 4;
      local_58 = uVar7 + 5;
      if (cmd->cdf_len != 0) {
        sVar3 = derTLEnc((octet *)0x0,0x87,cmd->cdf_len + 1);
        der = apdu + local_58;
        lStack_60 = 0;
        count_00 = cmd->cdf_len;
        if (count_00 != 0) {
          if ((count_00 < 0x100) && (cmd->rdf_len < 0x101)) {
            lStack_60 = 1;
          }
          else {
            lStack_60 = 3;
          }
        }
        memMove(der + sVar3 + 1,apdu + lStack_60 + 4,count_00);
        der[sVar3] = '\x02';
        sVar3 = derTLEnc(der,0x87,cmd->cdf_len + 1);
        local_58 = uVar7 + 6 + sVar3;
        beltCFBStart((void *)((long)state + 0x50),(octet *)((long)state + 0x20),0x20,
                     (octet *)((long)state + 0x40));
        beltCFBStepE(apdu + local_58,cmd->cdf_len,(void *)((long)state + 0x50));
        local_58 = local_58 + cmd->cdf_len;
      }
      if (uVar5 < 0x100) {
        oVar1 = (octet)uVar5;
      }
      else {
        *(ushort *)(apdu + 5) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
        oVar1 = '\0';
      }
      apdu[4] = oVar1;
      if (cmd->rdf_len != 0) {
        sVar3 = apduCmdRDFLenLen(cmd);
        sVar4 = derTLEnc(apdu + local_58,0x97,sVar3);
        local_58 = sVar4 + local_58;
        if (sVar3 == 2) {
          apdu[local_58] = *(octet *)((long)&cmd->rdf_len + 1);
          apdu[local_58 + 1] = (octet)cmd->rdf_len;
        }
        else if (sVar3 == 1) {
          apdu[local_58] = (octet)cmd->rdf_len;
        }
        else {
          apdu[local_58] = '\0';
          apdu[local_58 + 1] = *(octet *)((long)&cmd->rdf_len + 1);
          apdu[local_58 + 2] = (octet)cmd->rdf_len;
        }
        local_58 = local_58 + sVar3;
      }
      state_00 = (void *)((long)state + 0x50);
      beltMACStart(state_00,(octet *)state,0x20);
      beltMACStepA((octet *)((long)state + 0x40),0x10,state_00);
      beltMACStepA(apdu,4,state_00);
      beltMACStepA(apdu + uVar7 + 5,
                   ((ulong)((uint)(uVar5 < 0x100) * 2) | 0xfffffffffffffff9) + local_58,state_00);
      sVar3 = derTLEnc(apdu + local_58,0x8e,8);
      local_58 = sVar3 + local_58;
      beltMACStepG(apdu + local_58,state_00);
      memSet(apdu + local_58 + 8,'\0',1);
      if (count == (size_t *)0x0) {
        return 0;
      }
      sVar3 = local_58 + 9;
    }
  }
  *count = sVar3;
  return 0;
}

Assistant:

err_t btokSMCmdWrap(octet apdu[], size_t* count, const apdu_cmd_t* cmd,
	void* state)
{
	size_t cdf_len;
	size_t cdf_len_len;
	size_t offset;
	size_t c;
	btok_sm_st* st;
	// pre
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(count, O_PER_S));
	// некорректная команда? команду нужно защитить, а она уже защищена?
	if (!apduCmdIsValid(cmd) || state && (cmd->cla & 0x04))
		return ERR_BAD_APDU;
	// кодировать без защиты
	offset = apduCmdEnc(apdu, cmd);
	if (offset == SIZE_MAX)
		return ERR_BAD_APDU;
	// состояние не задано, т.е. защита не нужна?
	if (!state)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), cmd, apduCmdSizeof(cmd)));
	// новая длина cdf
	cdf_len = cmd->cdf_len;
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		cdf_len += c + 1;
	}
	if (cmd->rdf_len)
	{
		c = derEnc(0, 0x97, 0, apduCmdRDFLenLen(cmd));
		ASSERT(c != SIZE_MAX);
		cdf_len += c;
	}
	c = derEnc(0, 0x8E, 0, 8);
	ASSERT(c != SIZE_MAX);
	cdf_len += c;
	// новая длина длины cdf
	cdf_len_len = cdf_len < 256 ? 1 : 3;
	// общая длина
	offset = 4 + cdf_len_len + cdf_len + 1;
	// не задан выходной буфер, т.е. нужно определить только его длину?
	if (!apdu)
	{
		if (count)
		{
			ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
			ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*count = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(apdu, offset, state, btokSM_keep()));
	ASSERT(memIsDisjoint2(apdu, offset, cmd, apduCmdSizeof(cmd)));
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 1)
		return ERR_BAD_LOGIC;
	// уточнить заголовок
	offset = 0;
	apdu[0] |= 0x04;
	offset += 4;
	// перейти к cdf
	offset += cdf_len_len;
	// обработать cdf
	if (cmd->cdf_len)
	{
		c = derTLEnc(0, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		// подготовить значение
		memMove(apdu + offset + c + 1,
			apdu + 4 + apduCmdCDFLenLen(cmd), cmd->cdf_len);
		apdu[offset + c] = 0x02;
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x87, cmd->cdf_len + 1);
		ASSERT(c != SIZE_MAX);
		offset += c + 1;
		// зашифровать
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepE(apdu + offset, cmd->cdf_len, st->stack);
		// дальше
		offset += cmd->cdf_len;
	}
	// теперь можно перекодировать Lc
	ASSERT(cdf_len_len == 1 || cdf_len_len == 3);
	if (cdf_len_len == 1)
		apdu[4] = (octet)cdf_len;
	else
	{
		apdu[4] = 0;
		apdu[5] = (octet)(cdf_len / 256);
		apdu[6] = (octet)cdf_len;
	}
	// обработать длину rdf
	if (cmd->rdf_len)
	{
		size_t l = apduCmdRDFLenLen(cmd);
		// кодировать TL
		c = derTLEnc(apdu + offset, 0x97, l);
		ASSERT(c != SIZE_MAX);
		offset += c;
		// кодировать значение
		ASSERT(1 <= l && l <= 3);
		if (l == 1)
			apdu[offset] = (octet)(cmd->rdf_len);
		else if (l == 2)
		{
			apdu[offset] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 1] = (octet)cmd->rdf_len;
		}
		else
		{
			apdu[offset] = 0;
			apdu[offset + 1] = (octet)(cmd->rdf_len / 256);
			apdu[offset + 2] = (octet)cmd->rdf_len;
		}
		// дальше
		offset += l;
	}
	// вычислить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, 4, st->stack);
	ASSERT(offset >= 4 + cdf_len_len);
	beltMACStepA(apdu + 4 + cdf_len_len, offset - 4 - cdf_len_len, st->stack);
	c = derTLEnc(apdu + offset, 0x8E, 8);
	ASSERT(c != SIZE_MAX);
	offset += c;
	beltMACStepG(apdu + offset, st->stack);
	offset += 8;
	// кодировать новую длину rdf
	memSetZero(apdu + offset, 1);
	offset += 1;
	// возвратить длину
	if (count)
	{
		ASSERT(memIsDisjoint2(count, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(count, O_PER_S, cmd, apduCmdSizeof(cmd)));
		ASSERT(memIsDisjoint2(count, O_PER_S, apdu, offset));
		*count = offset;
	}
	// завершить
	return ERR_OK;
}